

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * parse_comma_pixel_type_list(char *s)

{
  int iVar1;
  char *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  char *pch;
  vector<int,_std::allocator<int>_> *aps;
  vector<int,_std::allocator<int>_> *this;
  char *local_20;
  
  this = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17b614);
  local_20 = strtok(in_RSI,",");
  while (local_20 != (char *)0x0) {
    iVar1 = strcmp(local_20,"RAW");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    iVar1 = strcmp(local_20,"RGB");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    iVar1 = strcmp(local_20,"BGR");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    iVar1 = strcmp(local_20,"GRAY");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    iVar1 = strcmp(local_20,"RGBA");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    iVar1 = strcmp(local_20,"BGRA");
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
    }
    local_20 = strtok((char *)0x0,",");
  }
  return this;
}

Assistant:

static std::vector<int> parse_comma_pixel_type_list(char* s)
{
    std::vector<int> aps;

    char* pch = strtok(s, ",");
    while (pch != NULL)
    {
        // RAW/RGB/BGR/GRAY/RGBA/BGRA
        if (strcmp(pch, "RAW") == 0)
            aps.push_back(-233);
        if (strcmp(pch, "RGB") == 0)
            aps.push_back(ncnn::Mat::PIXEL_RGB);
        if (strcmp(pch, "BGR") == 0)
            aps.push_back(ncnn::Mat::PIXEL_BGR);
        if (strcmp(pch, "GRAY") == 0)
            aps.push_back(ncnn::Mat::PIXEL_GRAY);
        if (strcmp(pch, "RGBA") == 0)
            aps.push_back(ncnn::Mat::PIXEL_RGBA);
        if (strcmp(pch, "BGRA") == 0)
            aps.push_back(ncnn::Mat::PIXEL_BGRA);

        pch = strtok(NULL, ",");
    }

    return aps;
}